

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O3

int __thiscall MPEGStreamReader::bufFromNAL(MPEGStreamReader *this)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  int iVar3;
  
  puVar2 = (this->super_AbstractStreamReader).m_curPos;
  if ((((long)((ulong)this->m_longCodesAllowed + 3) <=
        (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar2) && (*puVar2 == '\0')) &&
     (puVar2[1] == '\0')) {
    uVar1 = puVar2[2];
    if ((uVar1 == '\0' & this->m_longCodesAllowed) == 1) {
      iVar3 = 4;
      uVar1 = puVar2[3];
    }
    else {
      iVar3 = 3;
    }
    if (uVar1 == '\x01') {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int MPEGStreamReader::bufFromNAL() const
{
    if (m_bufEnd - m_curPos < (3 + (m_longCodesAllowed ? 1 : 0)))
        return 0;
    if (m_curPos[0] == 0 && m_curPos[1] == 0)
    {
        if (m_longCodesAllowed && m_curPos[2] == 0 && m_curPos[3] == 1)
            return 4;
        if (m_curPos[2] == 1)
            return 3;
    }
    return 0;
}